

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

void removeFd(Sockets *sockets,curl_socket_t fd,int mention)

{
  int local_1c;
  int i;
  int mention_local;
  curl_socket_t fd_local;
  Sockets *sockets_local;
  
  if (mention != 0) {
    curl_mfprintf(_stderr,"Remove socket fd %d\n",fd);
  }
  for (local_1c = 0; local_1c < sockets->count; local_1c = local_1c + 1) {
    if (sockets->sockets[local_1c] == fd) {
      if (local_1c < sockets->count + -1) {
        memmove(sockets->sockets + local_1c,sockets->sockets + (local_1c + 1),
                (long)(sockets->count - (local_1c + 1)) << 2);
      }
      sockets->count = sockets->count + -1;
    }
  }
  return;
}

Assistant:

static void removeFd(struct Sockets* sockets, curl_socket_t fd, int mention)
{
  int i;

  if(mention)
    fprintf(stderr, "Remove socket fd %d\n", (int) fd);

  for(i = 0; i < sockets->count; ++i) {
    if(sockets->sockets[i] == fd) {
      if(i < sockets->count - 1)
        memmove(&sockets->sockets[i], &sockets->sockets[i + 1],
              sizeof(curl_socket_t) * (sockets->count - (i + 1)));
      --sockets->count;
    }
  }
}